

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QPoint __thiscall
QListModeViewBase::initStaticLayout(QListModeViewBase *this,QListViewLayoutInfo *info)

{
  uint uVar1;
  uint t;
  uint uVar2;
  ulong uVar3;
  
  if (info->first == 0) {
    QList<int>::clear(&this->flowPositions);
    QList<int>::clear(&this->segmentPositions);
    QList<int>::clear(&this->segmentStartRows);
    QList<int>::clear(&this->segmentExtents);
    QList<int>::clear(&this->scrollValueMap);
    uVar1 = (info->bounds).x1.m_i + info->spacing;
    uVar2 = info->spacing + (info->bounds).y1.m_i;
    uVar3 = (ulong)uVar2;
    t = uVar1;
    if (info->flow == LeftToRight) {
      t = uVar2;
    }
    QList<int>::append(&this->segmentPositions,t);
    QList<int>::append(&this->segmentStartRows,0);
  }
  else {
    if (info->wrap == true) {
      if (info->flow == LeftToRight) {
        uVar1 = this->batchSavedPosition;
        uVar3 = (ulong)(uint)(this->segmentPositions).d.ptr[(this->segmentPositions).d.size + -1];
        goto LAB_00517ed4;
      }
      uVar1 = (this->segmentPositions).d.ptr[(this->segmentPositions).d.size + -1];
    }
    else {
      if (info->flow == LeftToRight) {
        uVar1 = this->batchSavedPosition;
        uVar3 = (ulong)(uint)(info->spacing + (info->bounds).y1.m_i);
        goto LAB_00517ed4;
      }
      uVar1 = info->spacing + (info->bounds).x1.m_i;
    }
    uVar3 = (ulong)(uint)this->batchSavedPosition;
  }
LAB_00517ed4:
  return (QPoint)((ulong)uVar1 | uVar3 << 0x20);
}

Assistant:

QPoint QListModeViewBase::initStaticLayout(const QListViewLayoutInfo &info)
{
    int x, y;
    if (info.first == 0) {
        flowPositions.clear();
        segmentPositions.clear();
        segmentStartRows.clear();
        segmentExtents.clear();
        scrollValueMap.clear();
        x = info.bounds.left() + info.spacing;
        y = info.bounds.top() + info.spacing;
        segmentPositions.append(info.flow == QListView::LeftToRight ? y : x);
        segmentStartRows.append(0);
    } else if (info.wrap) {
        if (info.flow == QListView::LeftToRight) {
            x = batchSavedPosition;
            y = segmentPositions.constLast();
        } else { // flow == QListView::TopToBottom
            x = segmentPositions.constLast();
            y = batchSavedPosition;
        }
    } else { // not first and not wrap
        if (info.flow == QListView::LeftToRight) {
            x = batchSavedPosition;
            y = info.bounds.top() + info.spacing;
        } else { // flow == QListView::TopToBottom
            x = info.bounds.left() + info.spacing;
            y = batchSavedPosition;
        }
    }
    return QPoint(x, y);
}